

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__simple_alpha_unweight_4ch(float *encode_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  
  pfVar1 = encode_buffer + width_times_channels;
  do {
    fVar2 = encode_buffer[3];
    if (7.523164e-37 <= fVar2) {
      fVar3 = 1.0 / fVar2;
      *encode_buffer = *encode_buffer * fVar3;
      encode_buffer[1] = encode_buffer[1] * fVar3;
      encode_buffer[2] = encode_buffer[2] * fVar3;
      encode_buffer[3] = encode_buffer[3] * fVar3;
      encode_buffer[3] = fVar2;
    }
    encode_buffer = encode_buffer + 4;
  } while (encode_buffer < pfVar1);
  return;
}

Assistant:

static void stbir__simple_alpha_unweight_4ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float alpha = encode[3];

#ifdef STBIR_SIMD
    stbir__simdf i,ia;
    STBIR_SIMD_NO_UNROLL(encode);
    if ( alpha >= stbir__small_float )
    {
      stbir__simdf_load1frep4( ia, 1.0f / alpha );
      stbir__simdf_load( i, encode );
      stbir__simdf_mult( i, i, ia );
      stbir__simdf_store( encode, i );
      encode[3] = alpha;
    }
#else
    if ( alpha >= stbir__small_float )
    {
      float ialpha = 1.0f / alpha;
      encode[0] *= ialpha;
      encode[1] *= ialpha;
      encode[2] *= ialpha;
    }
#endif
    encode += 4;
  } while ( encode < end_output );
}